

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O0

AssertionResult
testing::internal::
CmpHelperEQ<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)71>>
          (char *expected_expression,char *actual_expression,
          BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> *expected,
          BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71> *actual)

{
  SafeBool SVar1;
  SafeBool SVar2;
  ExprBase *in_RCX;
  BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71> *in_RDX;
  long extraout_RDX;
  long extraout_RDX_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX_01;
  BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> *in_RDI;
  string *in_R8;
  AssertionResult AVar4;
  BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> *value;
  string local_68 [32];
  string local_48 [23];
  undefined1 in_stack_ffffffffffffffcf;
  string *in_stack_ffffffffffffffd0;
  BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71> *expected_expression_00;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> sVar3
  ;
  
  value = in_RDI;
  SVar1 = mp::internal::ExprBase::operator_cast_to_function_pointer(in_RCX);
  SVar2 = mp::internal::ExprBase::operator_cast_to_function_pointer((ExprBase *)in_R8);
  if (SVar1 == SVar2 && (SVar1 == 0 || extraout_RDX == extraout_RDX_00)) {
    AVar4 = AssertionSuccess();
    sVar3 = AVar4.message_.ptr_;
  }
  else {
    expected_expression_00 = in_RDX;
    FormatForComparisonFailureMessage<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)71>>
              (value,in_RDX);
    FormatForComparisonFailureMessage<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)71>,mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>>
              ((BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71> *)value,
               (BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> *)in_RDX);
    EqFailure((char *)expected_expression_00,(char *)in_RCX,in_R8,in_stack_ffffffffffffffd0,
              (bool)in_stack_ffffffffffffffcf);
    std::__cxx11::string::~string(local_68);
    std::__cxx11::string::~string(local_48);
    sVar3.ptr_ = extraout_RDX_01;
  }
  AVar4.message_.ptr_ = sVar3.ptr_;
  AVar4._0_8_ = in_RDI;
  return AVar4;
}

Assistant:

AssertionResult CmpHelperEQ(const char* expected_expression,
                            const char* actual_expression,
                            const T1& expected,
                            const T2& actual) {
#ifdef _MSC_VER
# pragma warning(push)          // Saves the current warning state.
# pragma warning(disable:4389)  // Temporarily disables warning on
                                // signed/unsigned mismatch.
#endif

  if (expected == actual) {
    return AssertionSuccess();
  }

#ifdef _MSC_VER
# pragma warning(pop)          // Restores the warning state.
#endif

  return EqFailure(expected_expression,
                   actual_expression,
                   FormatForComparisonFailureMessage(expected, actual),
                   FormatForComparisonFailureMessage(actual, expected),
                   false);
}